

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O1

void __thiscall Commander::printHelp(Commander *this)

{
  long *plVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available commands: ",0x14);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  p_Var3 = (this->cmds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->cmds)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      plVar1 = *(long **)(p_Var3 + 2);
      if (plVar1 != (long *)0x0) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," \t- ",4);
        (**(code **)(*plVar1 + 0x10))(&local_50,plVar1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void Commander::printHelp()
{
    std::cout << "Available commands: " << cmds.size() << endl;
    std::map<std::string, Command*>::iterator itr;
    for (itr = cmds.begin(); itr != cmds.end(); ++itr) {
        Command *cmd = itr->second;
        if (cmd == NULL) continue;
        std::cout << itr->first << " \t- " << cmd->getDescription() << endl;
    }
}